

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O1

mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,mz_uint64 cur_file_ofs,mz_uint32 n)

{
  size_t sVar1;
  size_t __n;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  char buf [4096];
  undefined1 auStack_1038 [4104];
  
  __n = 0x1000;
  if (n < 0x1000) {
    __n = (size_t)n;
  }
  memset(auStack_1038,0,__n);
  do {
    if (n == 0) {
      return 1;
    }
    sVar4 = 0x1000;
    if (n < 0x1000) {
      sVar4 = (size_t)n;
    }
    sVar1 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,cur_file_ofs,auStack_1038,sVar4);
    iVar3 = (int)sVar4;
    sVar2 = sVar4;
    if (sVar1 != sVar4) {
      sVar2 = 0;
      iVar3 = 0;
    }
    cur_file_ofs = cur_file_ofs + sVar2;
    n = n - iVar3;
  } while (sVar1 == sVar4);
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip, mz_uint64 cur_file_ofs, mz_uint32 n)
{
    char buf[4096];
    memset(buf, 0, MZ_MIN(sizeof(buf), n));
    while (n)
    {
        mz_uint32 s = MZ_MIN(sizeof(buf), n);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_file_ofs, buf, s) != s)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_file_ofs += s;
        n -= s;
    }
    return MZ_TRUE;
}